

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

int INT_EVdfg_set_attr_list(EVdfg_stone stone,attr_list attrs)

{
  EVdfg_config_action act_00;
  int iVar1;
  EVdfg_config_action act;
  undefined8 uStack_20;
  undefined8 uStack_10;
  
  iVar1 = stone->stone_id;
  add_ref_attr_list(attrs);
  act_00.stone_id = iVar1;
  act_00.type = 8;
  act_00._8_8_ = uStack_20;
  act_00.u.bridge.action = (char *)attrs;
  act_00.u._8_8_ = uStack_10;
  iVar1 = EVdfg_perform_act_on_state(stone->dfg->working_state,act_00,1);
  return iVar1;
}

Assistant:

extern int
INT_EVdfg_set_attr_list(EVdfg_stone stone, attr_list attrs)
{
    EVdfg_config_action act;
    act.type = ACT_set_attrs;
    act.stone_id = stone->stone_id;
    act.u.attrs.attrs = attrs;
    add_ref_attr_list(attrs);
    return EVdfg_perform_act_on_state(stone->dfg->working_state, act, 1 /* add to queue */);
}